

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

maybe<color,_void> * __thiscall
pstore::command_line::parser<color,_void>::operator()
          (maybe<color,_void> *__return_storage_ptr__,parser<color,_void> *this,string *v)

{
  type tVar1;
  literal *plVar2;
  bool bVar3;
  long lVar4;
  __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  __it;
  __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  __it_00;
  __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  _Var5;
  string *local_38;
  
  __it._M_current =
       (this->super_parser_base).literals_.
       super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
       ._M_impl.super__Vector_impl_data._M_start;
  plVar2 = (this->super_parser_base).literals_.
           super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = ((long)plVar2 - (long)__it._M_current >> 3) * -0x71c71c71c71c71c7 >> 2;
  __it_00._M_current = __it._M_current;
  local_38 = v;
  if (0 < lVar4) {
    __it_00._M_current = __it._M_current + lVar4 * 4;
    lVar4 = lVar4 + 1;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
              ::operator()((_Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                            *)&local_38,__it);
      _Var5._M_current = __it._M_current;
      if (bVar3) goto LAB_0011b651;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
              ::operator()((_Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                            *)&local_38,__it._M_current + 1);
      _Var5._M_current = __it._M_current + 1;
      if (bVar3) goto LAB_0011b651;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
              ::operator()((_Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                            *)&local_38,__it._M_current + 2);
      _Var5._M_current = __it._M_current + 2;
      if (bVar3) goto LAB_0011b651;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
              ::operator()((_Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                            *)&local_38,__it._M_current + 3);
      _Var5._M_current = __it._M_current + 3;
      if (bVar3) goto LAB_0011b651;
      __it._M_current = __it._M_current + 4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = ((long)plVar2 - (long)__it_00._M_current >> 3) * -0x71c71c71c71c71c7;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var5._M_current = plVar2;
      if ((lVar4 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
                  ::operator()((_Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                                *)&local_38,__it_00), _Var5._M_current = __it_00._M_current, bVar3))
      goto LAB_0011b651;
      __it_00._M_current = __it_00._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
            ::operator()((_Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                          *)&local_38,__it_00);
    _Var5._M_current = __it_00._M_current;
    if (bVar3) goto LAB_0011b651;
    __it_00._M_current = __it_00._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
          ::operator()((_Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                        *)&local_38,__it_00);
  _Var5._M_current = __it_00._M_current;
  if (!bVar3) {
    _Var5._M_current = plVar2;
  }
LAB_0011b651:
  if (_Var5._M_current == plVar2) {
    __return_storage_ptr__->valid_ = false;
    *(undefined3 *)&__return_storage_ptr__->field_0x1 = 0;
    __return_storage_ptr__->storage_ = (type)0x0;
    __return_storage_ptr__->valid_ = false;
  }
  else {
    tVar1 = (type)(_Var5._M_current)->value;
    __return_storage_ptr__->valid_ = true;
    __return_storage_ptr__->storage_ = tVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

maybe<T> operator() (std::string const & v) const {
                auto begin = this->begin ();
                auto end = this->end ();
                auto it =
                    std::find_if (begin, end, [&v] (literal const & lit) { return v == lit.name; });
                if (it == end) {
                    return nothing<T> ();
                }
                return just (T (it->value));
            }